

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O1

void api_suite::run(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = 4;
  local_c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("map.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x27,"void api_suite::api_ctor_default()",&local_8,&local_c);
  api_ctor_array();
  api_make();
  api_size();
  api_contains();
  api_lower_bound();
  api_find();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_ctor_array();
    api_make();
    api_size();
    api_contains();
    api_lower_bound();
    api_find();
}